

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void print_leaf_node(char *node)

{
  uint uVar1;
  uint32_t *puVar2;
  ostream *poVar3;
  uint32_t i;
  ulong uVar4;
  
  puVar2 = leaf_node_num_cells(node);
  uVar1 = *puVar2;
  poVar3 = std::operator<<((ostream *)&std::cout,"leaf (size ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    leaf_node_key(node,(uint32_t)uVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"  - ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void print_leaf_node(char *node) {
	uint32_t numCells = *(leaf_node_num_cells(node));
	std::cout<<"leaf (size " << numCells << ")" << std::endl;
	for (uint32_t i = 0; i < numCells; ++i) {
		uint32_t key = *leaf_node_key(node, i);
		std::cout<<"  - " << i << " : " << key << std::endl;
	}
}